

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O0

void __thiscall
solitaire::SolitaireHandWithTwoCardsTest_addCardOnTableauPileWithoutHistoryRecord_Test::TestBody
          (SolitaireHandWithTwoCardsTest_addCardOnTableauPileWithoutHistoryRecord_Test *this)

{
  bool bVar1;
  TypedExpectation<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  *this_00;
  HistoryTrackerMock *this_01;
  MockSpec<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  *this_02;
  TypedExpectation<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  *this_03;
  Cards *this_04;
  char *message;
  char *in_R9;
  string local_f0;
  AssertHelper local_d0;
  Message local_c8;
  bool local_b9;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_;
  Matcher<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
  local_a0;
  MockSpec<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  local_88;
  PolymorphicAction local_61;
  Action<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  local_60;
  InSequence local_29;
  undefined1 local_28 [7];
  InSequence seq;
  Cards cardsToAdd;
  SolitaireHandWithTwoCardsTest_addCardOnTableauPileWithoutHistoryRecord_Test *this_local;
  
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_28,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
             (anonymous_namespace)::twoCards);
  testing::InSequence::InSequence(&local_29);
  SolitaireEmptyHandTest::expectSnapshotCreation<solitaire::piles::TableauPileMock>
            ((SolitaireEmptyHandTest *)this,
             (this->super_SolitaireHandWithTwoCardsTest).super_SolitaireEmptyHandTest.
             super_SolitaireTest.lastTableauPileMock,
             &(this->super_SolitaireHandWithTwoCardsTest).snapshotMock2);
  SolitaireEmptyHandTest::expectTryingAddCardsAndClearThem<solitaire::piles::TableauPileMock>
            ((SolitaireEmptyHandTest *)this,
             (this->super_SolitaireHandWithTwoCardsTest).super_SolitaireEmptyHandTest.
             super_SolitaireTest.lastTableauPileMock,(Cards *)local_28);
  this_00 = SolitaireEmptyHandTest::expectMoveOperationSnapshotCreation
                      ((SolitaireEmptyHandTest *)this,
                       &(this->super_SolitaireHandWithTwoCardsTest).snapshotMock2);
  testing::ReturnNull();
  testing::PolymorphicAction::operator_cast_to_Action(&local_60,&local_61);
  testing::internal::
  TypedExpectation<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  ::WillOnce(this_00,&local_60);
  testing::
  Action<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  ::~Action(&local_60);
  this_01 = &mock_ptr<testing::StrictMock<solitaire::archivers::HistoryTrackerMock>_>::operator*
                       (&(this->super_SolitaireHandWithTwoCardsTest).super_SolitaireEmptyHandTest.
                         super_SolitaireTest.historyTrackerMock)->super_HistoryTrackerMock;
  testing::
  Matcher<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,std::default_delete<solitaire::archivers::interfaces::Snapshot>>>
  ::Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,std::default_delete<solitaire::archivers::interfaces::Snapshot>>>
              *)&local_a0,(AnythingMatcher *)&testing::_);
  archivers::HistoryTrackerMock::gmock_save(&local_88,this_01,&local_a0);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::
            MockSpec<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
            ::operator()(&local_88,
                         (WithoutMatchers *)
                         ((long)&gtest_ar_.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         + 7),(void *)0x0);
  this_03 = testing::internal::
            MockSpec<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
            ::InternalExpectedAt
                      (this_02,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0x21f,"*historyTrackerMock","save(_)");
  testing::internal::
  TypedExpectation<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  ::Times(this_03,0);
  testing::internal::
  MockSpec<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  ::~MockSpec(&local_88);
  testing::
  Matcher<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
  ::~Matcher(&local_a0);
  piles::PileId::PileId
            ((PileId *)&gtest_ar_.message_,(PileId *)&(anonymous_namespace)::lastTableauPileId);
  Solitaire::tryAddCardsOnTableauPile
            (&(this->super_SolitaireHandWithTwoCardsTest).super_SolitaireEmptyHandTest.
              super_SolitaireTest.solitaire,(PileId *)&gtest_ar_.message_);
  this_04 = Solitaire::getCardsInHand
                      (&(this->super_SolitaireHandWithTwoCardsTest).super_SolitaireEmptyHandTest.
                        super_SolitaireTest.solitaire);
  local_b9 = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::empty
                       (this_04);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b8,&local_b9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f0,(internal *)local_b8,
               (AssertionResult *)"solitaire.getCardsInHand().empty()","false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
               ,0x222,message);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  testing::InSequence::~InSequence(&local_29);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::~vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_28);
  return;
}

Assistant:

TEST_F(SolitaireHandWithTwoCardsTest, addCardOnTableauPileWithoutHistoryRecord) {
    auto cardsToAdd {twoCards};

    InSequence seq;
    expectSnapshotCreation(lastTableauPileMock, snapshotMock2);
    expectTryingAddCardsAndClearThem(lastTableauPileMock, cardsToAdd);
    expectMoveOperationSnapshotCreation(snapshotMock2).WillOnce(ReturnNull());
    EXPECT_CALL(*historyTrackerMock, save(_)).Times(0);

    solitaire.tryAddCardsOnTableauPile(lastTableauPileId);
    EXPECT_TRUE(solitaire.getCardsInHand().empty());
}